

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O0

bool __thiscall HEkkDual::bailoutOnDualObjective(HEkkDual *this)

{
  double *pdVar1;
  double dVar2;
  bool bVar3;
  long in_RDI;
  HEkkDual *in_stack_00000210;
  
  if (((((*(byte *)(*(long *)(in_RDI + 0x10) + 0x3708) & 1) == 0) &&
       (*(int *)(*(long *)(in_RDI + 0x10) + 0x2288) == 1)) && (*(int *)(in_RDI + 0xe4) == 2)) &&
     (dVar2 = *(double *)(*(long *)(in_RDI + 0x10) + 0x2958),
     pdVar1 = (double *)(*(long *)(*(long *)(in_RDI + 0x10) + 8) + 0x140),
     *pdVar1 <= dVar2 && dVar2 != *pdVar1)) {
    bVar3 = reachedExactObjectiveBound(in_stack_00000210);
    *(bool *)(*(long *)(in_RDI + 0x10) + 0x3708) = bVar3;
  }
  return (bool)(*(byte *)(*(long *)(in_RDI + 0x10) + 0x3708) & 1);
}

Assistant:

bool HEkkDual::bailoutOnDualObjective() {
  if (ekk_instance_.solve_bailout_) {
    // Bailout has already been decided: check that it's for one of these
    // reasons
    assert(ekk_instance_.model_status_ == HighsModelStatus::kTimeLimit ||
           ekk_instance_.model_status_ == HighsModelStatus::kIterationLimit ||
           ekk_instance_.model_status_ == HighsModelStatus::kObjectiveBound);
  } else if (ekk_instance_.lp_.sense_ == ObjSense::kMinimize &&
             solve_phase == kSolvePhase2) {
    if (ekk_instance_.info_.updated_dual_objective_value >
        ekk_instance_.options_->objective_bound)
      ekk_instance_.solve_bailout_ = reachedExactObjectiveBound();
  }
  return ekk_instance_.solve_bailout_;
}